

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamUtils.cpp
# Opt level: O0

ostream * operator<<(ostream *lhs,EntityType *rhs)

{
  byte bVar1;
  unsigned_short uVar2;
  ostream *poVar3;
  EntityType *rhs_local;
  ostream *lhs_local;
  
  poVar3 = std::operator<<(lhs,"EntityType (");
  bVar1 = DIS::EntityType::getEntityKind(rhs);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bVar1);
  poVar3 = std::operator<<(poVar3,",");
  bVar1 = DIS::EntityType::getDomain(rhs);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bVar1);
  poVar3 = std::operator<<(poVar3,",");
  uVar2 = DIS::EntityType::getCountry(rhs);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)uVar2);
  poVar3 = std::operator<<(poVar3,",");
  bVar1 = DIS::EntityType::getCategory(rhs);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bVar1);
  poVar3 = std::operator<<(poVar3,",");
  bVar1 = DIS::EntityType::getSubcategory(rhs);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bVar1);
  std::operator<<(poVar3,") ");
  return lhs;
}

Assistant:

std::ostream& operator <<(std::ostream& lhs, const DIS::EntityType& rhs)
{
   lhs << "EntityType ("
       << (unsigned int)rhs.getEntityKind()
       << "," << (unsigned int)rhs.getDomain()
       << "," << (unsigned int)rhs.getCountry()
       << "," << (unsigned int)rhs.getCategory()
       << "," << (unsigned int)rhs.getSubcategory()
       << ") ";
   return lhs;
}